

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

PBuffer __thiscall Buffer::get_subbuffer(Buffer *this,size_t offset,size_t _size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar1;
  __shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> a_Stack_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  EndianessMode local_38 [2];
  size_t local_30;
  
  local_30 = _size;
  std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Buffer,void>
            (a_Stack_48,(__weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(offset + 8));
  std::
  make_shared<Buffer,std::shared_ptr<Buffer>,unsigned_long&,unsigned_long&,Buffer::EndianessMode&>
            ((shared_ptr<Buffer> *)this,(unsigned_long *)a_Stack_48,&local_30,local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PBuffer)PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
Buffer::get_subbuffer(size_t offset, size_t _size) {
  return std::make_shared<Buffer>(shared_from_this(), offset, _size, endianess);
}